

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O1

void __thiscall Liby::EventLoopGroup::EventLoopGroup(EventLoopGroup *this,int n,string *chooser)

{
  pointer *pppEVar1;
  pointer pcVar2;
  iterator __position;
  int iVar3;
  undefined1 local_59;
  vector<Liby::EventLoop*,std::allocator<Liby::EventLoop*>> *local_58;
  shared_ptr<Liby::EventLoop> local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  this->n_ = n;
  *(undefined8 *)&(this->bf_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->bf_).super__Function_base._M_functor + 8) = 0;
  (this->bf_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->bf_)._M_invoker = (_Invoker_type)0x0;
  local_38 = &this->chooser_;
  local_40 = &(this->chooser_).field_2;
  (this->chooser_)._M_dataplus._M_p = (pointer)local_40;
  pcVar2 = (chooser->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar2,pcVar2 + chooser->_M_string_length);
  local_58 = (vector<Liby::EventLoop*,std::allocator<Liby::EventLoop*>> *)&this->ploops_;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ploops_).super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ploops_).super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ploops_).super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loops_).
  super__Vector_base<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (-1 < n) {
    iVar3 = n + 1;
    do {
      local_50.super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Liby::EventLoop,std::allocator<Liby::EventLoop>,std::__cxx11::string_const&>
                (&local_50.super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(EventLoop **)&local_50,(allocator<Liby::EventLoop> *)&local_59,
                 chooser);
      std::vector<std::shared_ptr<Liby::EventLoop>,std::allocator<std::shared_ptr<Liby::EventLoop>>>
      ::emplace_back<std::shared_ptr<Liby::EventLoop>>
                ((vector<std::shared_ptr<Liby::EventLoop>,std::allocator<std::shared_ptr<Liby::EventLoop>>>
                  *)&this->loops_,&local_50);
      if (local_50.super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_50.super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->loops_).
           super__Vector_base<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __position._M_current =
           (this->ploops_).super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->ploops_).super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Liby::EventLoop*,std::allocator<Liby::EventLoop*>>::
        _M_realloc_insert<Liby::EventLoop*>(local_58,__position,(EventLoop **)&local_50);
      }
      else {
        *__position._M_current =
             local_50.super___shared_ptr<Liby::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pppEVar1 = &(this->ploops_).
                    super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  EventLoop::bind_to_thread((EventLoop *)**(undefined8 **)local_58);
  return;
}

Assistant:

EventLoopGroup::EventLoopGroup(int n, const std::string &chooser)
    : n_(n), chooser_(chooser) {
    for (int i = 0; i < n + 1; i++) {
        loops_.emplace_back(std::make_shared<EventLoop>(chooser));
        ploops_.push_back(loops_.back().get());
    }
    ploops_[0]->bind_to_thread();
}